

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.cpp
# Opt level: O1

string * __thiscall
duckdb::TableRef::BaseToString
          (string *__return_storage_ptr__,TableRef *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_name_alias)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string local_48;
  
  AliasToString(&local_48,this,column_name_alias);
  ::std::__cxx11::string::_M_append((char *)result,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  SampleToString_abi_cxx11_(&local_48,this);
  ::std::__cxx11::string::_M_append((char *)result,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (result->_M_dataplus)._M_p;
  paVar1 = &result->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&result->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = result->_M_string_length;
  (result->_M_dataplus)._M_p = (pointer)paVar1;
  result->_M_string_length = 0;
  (result->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string TableRef::BaseToString(string result, const vector<string> &column_name_alias) const {
	result += AliasToString(column_name_alias);
	result += SampleToString();
	return result;
}